

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O2

RealType __thiscall OpenMD::Snapshot::getPotentialEnergy(Snapshot *this)

{
  RealType RVar1;
  
  if (this->hasPotentialEnergy == true) {
    RVar1 = (this->frameData).potentialEnergy;
  }
  else {
    RVar1 = getLongRangePotential(this);
    (this->frameData).potentialEnergy = RVar1;
    RVar1 = getShortRangePotential(this);
    (this->frameData).potentialEnergy = RVar1 + (this->frameData).potentialEnergy;
    RVar1 = getSelfPotential(this);
    (this->frameData).potentialEnergy = RVar1 + (this->frameData).potentialEnergy;
    RVar1 = getExcludedPotential(this);
    RVar1 = RVar1 + (this->frameData).potentialEnergy;
    (this->frameData).potentialEnergy = RVar1;
    this->hasPotentialEnergy = true;
    this->hasTotalEnergy = false;
  }
  return RVar1;
}

Assistant:

RealType Snapshot::getPotentialEnergy() {
    if (!hasPotentialEnergy) {
      frameData.potentialEnergy = this->getLongRangePotential();
      frameData.potentialEnergy += this->getShortRangePotential();
      frameData.potentialEnergy += this->getSelfPotential();
      frameData.potentialEnergy += this->getExcludedPotential();
      hasPotentialEnergy = true;
      hasTotalEnergy     = false;
    }
    return frameData.potentialEnergy;
  }